

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsByPartitionAsync
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *poVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  threadData *ptVar2;
  uint uVar3;
  undefined1 auVar4 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  unique_lock<std::mutex> l;
  undefined1 local_f1;
  long local_f0;
  int local_e8;
  int local_e4;
  long local_e0;
  packaged_task<void_()> local_d8;
  _Task_state<std::_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>,_std::allocator<int>,_void_()>
  *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  long local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  undefined1 local_88 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  _Tuple_impl<7UL,_double_*> local_78;
  _Head_base<6UL,_int,_false> local_70;
  _Head_base<5UL,_const_int_*,_false> local_68;
  _Head_base<4UL,_const_int_*,_false> local_60;
  _Head_base<3UL,_const_int_*,_false> local_58;
  _Head_base<2UL,_const_int_*,_false> local_50;
  _Head_base<1UL,_const_int_*,_false> local_48;
  _Head_base<0UL,_beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_false> local_40;
  
  uVar7 = this->kNumThreads;
  local_e8 = partitionCount / (int)uVar7;
  uVar3 = partitionCount;
  if ((int)uVar7 < partitionCount) {
    uVar3 = uVar7;
  }
  local_b0 = bufferIndices;
  local_a8 = categoryWeightsIndices;
  local_a0 = stateFrequenciesIndices;
  local_98 = cumulativeScaleIndices;
  local_90 = partitionIndices;
  if (0 < (int)uVar3) {
    local_b8 = (ulong)uVar3 << 4;
    lVar11 = 0x88;
    uVar10 = (long)partitionCount % (long)(int)uVar7 & 0xffffffff;
    local_f0 = 0;
    iVar6 = 0;
    do {
      iVar9 = (int)uVar10;
      local_88 = (undefined1  [8])0x251;
      local_78.super__Head_base<7UL,_double_*,_false>._M_head_impl =
           (_Head_base<7UL,_double_*,_false>)(outSumLogLikelihoodByPartition + iVar6);
      iVar8 = (local_e8 + 1) - (uint)(iVar9 == 0);
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58._M_head_impl = local_a0 + iVar6;
      local_c8 = (_Task_state<std::_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>,_std::allocator<int>,_void_()>
                  *)0x0;
      uVar10 = (ulong)(iVar9 - 1);
      if (iVar9 == 0) {
        uVar10 = 0;
      }
      local_68._M_head_impl = local_90 + iVar6;
      local_60._M_head_impl = local_98 + iVar6;
      local_48._M_head_impl = local_b0 + iVar6;
      local_50._M_head_impl = local_a8 + iVar6;
      local_e4 = iVar6;
      local_70._M_head_impl = iVar8;
      local_40._M_head_impl = this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::__future_base::_Task_state<std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,std::allocator<int>,void()>,std::allocator<int>,std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,std::allocator<int>const&>
                (&_Stack_c0,&local_c8,(allocator<int> *)&local_f1,
                 (_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
                  *)local_88,(allocator<int> *)&local_f1);
      local_d8._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = &local_c8->super__Task_state_base<void_()>;
      local_d8._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Stack_c0._M_pi;
      std::packaged_task<void_()>::get_future((packaged_task<void_()> *)local_88);
      p_Var5 = p_Stack_80;
      auVar4 = local_88;
      local_88 = (undefined1  [8])0x0;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + local_f0);
      poVar1 = (offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + local_f0);
      *poVar1 = (offset_in_BeagleCPUImpl<double,_1,_0>_to_subr)auVar4;
      poVar1[1] = (offset_in_BeagleCPUImpl<double,_1,_0>_to_subr)p_Var5;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      local_e0 = lVar11;
      if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
      }
      lVar11 = local_e0;
      ptVar2 = this->gThreads;
      local_88 = (undefined1  [8])((long)&(ptVar2->t)._M_id._M_thread + local_e0);
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((ulong)p_Stack_80 & 0xffffffffffffff00);
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(p_Stack_80._1_7_,1);
      bufferIndices = (int *)&local_d8;
      std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>::
      emplace_back<std::packaged_task<void()>>
                ((deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>> *)
                 ((long)ptVar2 + lVar11 + -0x80),(packaged_task<void_()> *)bufferIndices);
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_88);
      lVar11 = local_e0;
      std::condition_variable::notify_one();
      iVar6 = local_e4 + iVar8;
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
      std::packaged_task<void_()>::~packaged_task(&local_d8);
      lVar11 = lVar11 + 0xb8;
      local_f0 = local_f0 + 0x10;
    } while (local_b8 != local_f0);
    uVar7 = this->kNumThreads;
  }
  if (0 < (int)uVar7) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      std::__basic_future<void>::wait
                ((__basic_future<void> *)
                 ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar11),bufferIndices);
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar12 < this->kNumThreads);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartitionAsync(
                                                        const int* bufferIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        int partitionCount,
                                                        double* outSumLogLikelihoodByPartition) {


    int partitionsPerThreadFloor = partitionCount / kNumThreads;
    int partitionsRemainder = partitionCount % kNumThreads;
    int currentPartitionIndex = 0;
    int threadsUsed = (partitionCount < kNumThreads ? partitionCount : kNumThreads);
    for (int i=0; i<threadsUsed; i++) {
        int partitionCountThread = partitionsPerThreadFloor;
        if (partitionsRemainder) {
            partitionCountThread++;
            partitionsRemainder--;
        }

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition, this,
                      &bufferIndices[currentPartitionIndex], &categoryWeightsIndices[currentPartitionIndex],
                      &stateFrequenciesIndices[currentPartitionIndex], &cumulativeScaleIndices[currentPartitionIndex],
                      &partitionIndices[currentPartitionIndex], partitionCountThread,
                      &outSumLogLikelihoodByPartition[currentPartitionIndex]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();

        currentPartitionIndex += partitionCountThread;
    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}